

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxu.c
# Opt level: O1

void Fxu_MatrixRingVarsUnmark(Fxu_Matrix *p)

{
  Fxu_Var *pFVar1;
  Fxu_Var *pFVar2;
  Fxu_Var *pFVar3;
  
  pFVar2 = p->pOrderVars;
  if (pFVar2 != (Fxu_Var *)0x0) {
    pFVar3 = pFVar2;
    pFVar1 = (Fxu_Var *)0x1;
    if (pFVar2 == (Fxu_Var *)0x1) goto LAB_004b8233;
    do {
      pFVar3 = pFVar2;
      pFVar1 = pFVar2->pOrder;
LAB_004b8233:
      while( true ) {
        pFVar2 = pFVar1;
        if (pFVar3 == (Fxu_Var *)0x1) goto LAB_004b8251;
        pFVar3->pOrder = (Fxu_Var *)0x0;
        if (pFVar2 != (Fxu_Var *)0x1) break;
        pFVar3 = pFVar2;
        pFVar1 = (Fxu_Var *)0x1;
      }
    } while( true );
  }
LAB_004b8251:
  p->pOrderVars = (Fxu_Var *)0x0;
  p->ppTailVars = (Fxu_Var **)0x0;
  return;
}

Assistant:

void Fxu_MatrixRingVarsUnmark( Fxu_Matrix * p )
{
    Fxu_Var * pVar, * pVar2;
    // unmark the vars
    Fxu_MatrixForEachVarInRingSafe( p, pVar, pVar2 )
        pVar->pOrder = NULL;
    Fxu_MatrixRingVarsReset( p );
}